

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O0

void __thiscall binpac::FlowBuffer::NewData(FlowBuffer *this,const_byteptr begin,const_byteptr end)

{
  const_byteptr in_RDX;
  const_byteptr in_RSI;
  FlowBuffer *in_RDI;
  
  ClearPreviousData(in_RDI);
  in_RDI->orig_data_begin_ = in_RSI;
  in_RDI->orig_data_end_ = in_RDX;
  in_RDI->data_seq_at_orig_data_end_ =
       in_RDI->data_seq_at_orig_data_end_ + ((int)in_RDX - (int)in_RSI);
  MarkOrCopy(in_RDI);
  return;
}

Assistant:

void FlowBuffer::NewData(const_byteptr begin, const_byteptr end)
	{
	BINPAC_ASSERT(begin <= end);

	ClearPreviousData();

	BINPAC_ASSERT((buffer_n_ == 0 && message_complete_) || orig_data_begin_ == orig_data_end_);

	orig_data_begin_ = begin;
	orig_data_end_ = end;
	data_seq_at_orig_data_end_ += (end - begin);

	MarkOrCopy();
	}